

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompression.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_872c2::pixelArray::pixelArray(pixelArray *this,int height,int width)

{
  long sizeX;
  long sizeY;
  long lVar1;
  
  sizeX = (long)height;
  sizeY = (long)width;
  Imf_3_2::Array2D<unsigned_int>::Array2D(&this->i,sizeX,sizeY);
  Imf_3_2::Array2D<float>::Array2D(&this->f,sizeX,sizeY);
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D(&this->h,sizeX,sizeY);
  this->rgba[3]._sizeY = 0;
  this->rgba[3]._data = (half *)0x0;
  this->rgba[2]._data = (half *)0x0;
  this->rgba[3]._sizeX = 0;
  this->rgba[2]._sizeX = 0;
  this->rgba[2]._sizeY = 0;
  this->rgba[1]._sizeY = 0;
  this->rgba[1]._data = (half *)0x0;
  this->rgba[0]._data = (half *)0x0;
  this->rgba[1]._sizeX = 0;
  this->rgba[0]._sizeX = 0;
  this->rgba[0]._sizeY = 0;
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x18) {
    Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
              ((Array2D<Imath_3_2::half> *)((long)&this->rgba[0]._sizeX + lVar1),sizeX,sizeY);
  }
  return;
}

Assistant:

pixelArray (int height, int width)
        : i (height, width), f (height, width), h (height, width)
    {
        for (int c = 0; c < 4; ++c)
        {
            rgba[c].resizeErase (height, width);
        }
    }